

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O1

void __thiscall
Test<unsigned_int,unsigned_int,double>::
Test<unsigned_int(*)(unsigned_int),unsigned_int(*)(unsigned_int)>
          (Test<unsigned_int,unsigned_int,double> *this,string *suiteName,
          input_generator_t *inputGenerator,input_range_t inputRange,uint64_t samplesInRange,
          _func_uint_uint *refFunc,_func_uint_uint *dummyFunc)

{
  pointer pcVar1;
  iterator __position;
  uint uVar2;
  long lVar3;
  uint_fast64_t j;
  ulong uVar4;
  long lVar5;
  storage_t dummy;
  double local_58;
  Test<unsigned_int,unsigned_int,double> *local_50;
  input_range_t local_48;
  Test<unsigned_int,unsigned_int,double> *local_40;
  long local_38;
  
  local_50 = this + 0x10;
  *(Test<unsigned_int,unsigned_int,double> **)this = local_50;
  pcVar1 = (suiteName->_M_dataplus)._M_p;
  local_48 = inputRange;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + suiteName->_M_string_length);
  *(input_range_t *)(this + 0x20) = local_48;
  local_58 = (double)samplesInRange;
  if ((inputGenerator->super__Function_base)._M_manager != (_Manager_type)0x0) {
    local_40 = this + 0x28;
    (*inputGenerator->_M_invoker)
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
               (_Any_data *)inputGenerator,&local_48,(unsigned_long *)&local_58);
    *(undefined8 *)(this + 0x50) = 0;
    *(undefined8 *)(this + 0x58) = 0;
    *(undefined8 *)(this + 0x40) = 0;
    *(undefined8 *)(this + 0x48) = 0;
    *(undefined4 *)(this + 0x60) = 0;
    lVar3 = *(long *)(this + 0x28);
    if (*(long *)(this + 0x30) != lVar3) {
      uVar4 = 0;
      do {
        uVar2 = (*refFunc)(*(uint *)(lVar3 + uVar4 * 4));
        local_58 = (double)uVar2;
        __position._M_current = *(double **)(this + 0x48);
        if (__position._M_current == *(double **)(this + 0x50)) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)(this + 0x40),__position,&local_58);
        }
        else {
          *__position._M_current = local_58;
          *(double **)(this + 0x48) = __position._M_current + 1;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < (ulong)(*(long *)(this + 0x30) - *(long *)(this + 0x28) >> 2));
    }
    local_58 = 0.0;
    lVar5 = 0;
    local_38 = std::chrono::_V2::system_clock::now();
    do {
      if (*(long *)(this + 0x30) != *(long *)(this + 0x28)) {
        uVar4 = 0;
        do {
          uVar2 = (*dummyFunc)(*(uint *)(lVar3 + uVar4 * 4));
          local_58 = (double)uVar2;
          uVar4 = uVar4 + 1;
        } while (uVar4 < (ulong)(*(long *)(this + 0x30) - *(long *)(this + 0x28) >> 2));
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 10000);
    lVar3 = std::chrono::_V2::system_clock::now();
    *(ulong *)(this + 0x58) = (ulong)(lVar3 - local_38) / 10000;
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

Test(const std::string& suiteName, input_generator_t inputGenerator, input_range_t inputRange, uint64_t samplesInRange, ReferenceFunction refFunc, DummyFunction dummyFunc)
        : m_suiteName(suiteName), m_inputRange(inputRange), m_inputValues(inputGenerator(inputRange, samplesInRange))
    {
        // generate reference result values
        const input_t* inputData = m_inputValues.data();
        for (uint_fast64_t i = 0; i < m_inputValues.size(); ++i)
        {
            m_referenceValues.push_back(refFunc(inputData[i]));
        }
        // make sure we use a volatile destination, so values are not thrown away.
        volatile storage_t dummy{};
        // "calibrate" the speed loop
        auto startCalib = std::chrono::high_resolution_clock::now();
        for (uint_fast64_t j = 0; j < LOOPCOUNT; ++j)
        {
            for (uint_fast64_t i = 0; i < m_inputValues.size(); ++i)
            {
                dummy = dummyFunc(inputData[i]);
            }
        }
        auto overheadDuration = std::chrono::high_resolution_clock::now() - startCalib;
        m_overheadNs = std::chrono::duration_cast<std::chrono::nanoseconds>(overheadDuration).count() / LOOPCOUNT;
    }